

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

wchar_t main(wchar_t argc,char **argv)

{
  char cVar1;
  uint uVar2;
  wchar_t wVar3;
  uint uVar4;
  wchar_t wVar5;
  __mode_t __mask;
  wchar_t wVar6;
  char *__s;
  size_t sVar7;
  char *__dest;
  char *pcVar8;
  size_t sVar9;
  byte *__dest_00;
  char *pcVar10;
  tm *__tp;
  long *__s_00;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  byte *pbVar15;
  byte bVar16;
  byte *pbVar17;
  char **ppcVar18;
  ulong uVar19;
  char *__s_01;
  uint uVar20;
  ulong uVar21;
  int *piVar22;
  bool bVar23;
  time_t now;
  wchar_t test_set [52];
  char tmpdir [256];
  sigaction sa;
  char tmpdir_timestamp [256];
  char *local_7a8;
  uint local_79c;
  char **local_790;
  char *local_780;
  byte *local_778;
  char *local_770;
  time_t local_750;
  uint local_748 [52];
  char local_678 [256];
  char local_578 [64];
  _union_1457 local_538;
  sigset_t local_530;
  undefined4 local_4b0;
  char local_138 [264];
  
  __s = getcwd((char *)0x0,0x1000);
  sVar7 = strlen(__s);
  cVar1 = __s[sVar7 - 1];
  while (cVar1 == '\n') {
    __s[sVar7 - 1] = '\0';
    sVar7 = strlen(__s);
    cVar1 = __s[sVar7 - 1];
  }
  __s_01 = *argv;
  sVar7 = strlen(__s_01);
  pcVar10 = (char *)(sVar7 + 1);
  __dest = (char *)malloc((size_t)pcVar10);
  if (__dest == (char *)0x0) goto LAB_001083fd;
  strcpy(__dest,__s_01);
  iVar11 = 0;
  iVar13 = 0;
  pcVar10 = __s_01;
  while( true ) {
    pcVar8 = pcVar10 + 1;
    cVar1 = *pcVar10;
    pcVar10 = pcVar8;
    iVar14 = iVar11;
    if (((cVar1 != '/') && (cVar1 != '\\')) && (pcVar10 = __s_01, iVar14 = iVar13, cVar1 == '\0'))
    break;
    iVar11 = iVar11 + 1;
    __s_01 = pcVar10;
    iVar13 = iVar14;
    pcVar10 = pcVar8;
  }
  __dest[iVar13] = '\0';
  if (*__dest == '/') {
LAB_001075b0:
    __dest_00 = (byte *)getenv("BSDTAR");
    testprogfile = (char *)__dest_00;
    local_7a8 = getenv("TMPDIR");
    if (((local_7a8 == (char *)0x0) && (local_7a8 = getenv("TMP"), local_7a8 == (char *)0x0)) &&
       (local_7a8 = getenv("TEMP"), local_7a8 == (char *)0x0)) {
      pcVar10 = getenv("TEMPDIR");
      local_7a8 = "/tmp";
      if (pcVar10 != (char *)0x0) {
        local_7a8 = pcVar10;
      }
    }
    pcVar10 = getenv("BSDTAR_DEBUG");
    if (pcVar10 != (char *)0x0) {
      dump_on_failure = 1;
    }
    pcVar10 = getenv("_VERBOSITY_LEVEL");
    if (pcVar10 == (char *)0x0) {
      bVar23 = true;
    }
    else {
      wVar3 = atoi(pcVar10);
      bVar23 = (uint)(wVar3 + L'\xfffffffd') < 0xfffffffc;
      verbosity = L'\0';
      if (!bVar23) {
        verbosity = wVar3;
      }
    }
    wVar3 = verbosity;
    refdir = getenv("BSDTAR_TEST_FILES");
    ppcVar18 = argv + 1;
    pcVar10 = argv[1];
    wVar5 = until_failure;
    while ((pcVar10 != (char *)0x0 && (*pcVar10 == '-'))) {
      ppcVar18 = ppcVar18 + 1;
      bVar16 = pcVar10[1];
      if (bVar16 != 0) {
        pbVar15 = (byte *)(pcVar10 + 1);
        do {
          pbVar15 = pbVar15 + 1;
          if ((bVar16 & 0xfd) == 0x70) {
            pbVar17 = pbVar15;
            if (*pbVar15 == 0) {
              pbVar17 = (byte *)*ppcVar18;
              if (pbVar17 == (byte *)0x0) goto LAB_001083c1;
              ppcVar18 = ppcVar18 + 1;
            }
            pbVar15 = (byte *)0x118b73;
          }
          else {
            pbVar17 = (byte *)0x0;
          }
          switch(bVar16) {
          case 0x6b:
            keep_temp_files = 1;
            break;
          case 0x6c:
          case 0x6d:
          case 0x6e:
          case 0x6f:
          case 0x73:
          case 0x74:
            goto switchD_0010771d_caseD_6c;
          case 0x70:
            __dest_00 = pbVar17;
            testprogfile = (char *)pbVar17;
            break;
          case 0x71:
            if (bVar23) {
              wVar3 = wVar3 + L'\xffffffff';
              verbosity = wVar3;
            }
            break;
          case 0x72:
            refdir = (char *)pbVar17;
            break;
          case 0x75:
            wVar5 = wVar5 + L'\x01';
            until_failure = wVar5;
            break;
          case 0x76:
            if (bVar23) {
              wVar3 = wVar3 + L'\x01';
              verbosity = wVar3;
            }
            break;
          default:
            if (bVar16 != 100) goto switchD_0010771d_caseD_6c;
            dump_on_failure = 1;
          }
          bVar16 = *pbVar15;
        } while (bVar16 != 0);
      }
      pcVar10 = *ppcVar18;
    }
    if (__dest_00 == (byte *)0x0) {
      sVar7 = strlen(__dest);
      pcVar10 = (char *)(sVar7 + 8);
      __dest_00 = (byte *)malloc((size_t)pcVar10);
      if (__dest_00 == (byte *)0x0) goto LAB_00108407;
      strcpy((char *)__dest_00,__dest);
      sVar7 = strlen((char *)__dest_00);
      (__dest_00 + sVar7)[0] = 0x2f;
      (__dest_00 + sVar7)[1] = 0;
      sVar7 = strlen((char *)__dest_00);
      pbVar15 = __dest_00 + sVar7;
      pbVar15[0] = 0x62;
      pbVar15[1] = 0x73;
      pbVar15[2] = 100;
      pbVar15[3] = 0x74;
      pbVar15 = __dest_00 + sVar7 + 3;
      pbVar15[0] = 0x74;
      pbVar15[1] = 0x61;
      pbVar15[2] = 0x72;
      pbVar15[3] = 0;
      testprogfile = (char *)__dest_00;
      local_778 = __dest_00;
    }
    else {
      local_778 = (byte *)0x0;
    }
    sVar7 = strlen((char *)__dest_00);
    pcVar10 = (char *)malloc(sVar7 + 3);
    pcVar10[0] = '\"';
    pcVar10[1] = '\0';
    strcat(pcVar10,(char *)__dest_00);
    sVar7 = strlen(pcVar10);
    (pcVar10 + sVar7)[0] = '\"';
    (pcVar10 + sVar7)[1] = '\0';
    local_538 = (_union_1457)0x1;
    testprog = pcVar10;
    sigemptyset(&local_530);
    local_4b0 = 0;
    sigaction(0xd,(sigaction *)&local_538,(sigaction *)0x0);
    local_750 = time((time_t *)0x0);
    uVar21 = 0;
    do {
      __tp = localtime(&local_750);
      strftime(local_138,0x100,"%Y-%m-%dT%H.%M.%S",__tp);
      sprintf(local_678,"%s/%s.%s-%03d",local_7a8,__s_01,local_138,uVar21);
      wVar3 = assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/main.c"
                                 ,L'઴',local_678,L'ǭ');
      if (wVar3 != L'\0') goto LAB_0010790f;
      uVar20 = (int)uVar21 + 1;
      uVar21 = (ulong)uVar20;
    } while (uVar20 != 1000);
    main_cold_7();
LAB_0010790f:
    pcVar10 = refdir;
    memset(&local_538,0,0x200);
    if (pcVar10 == (char *)0x0) {
      __s_00 = (long *)getcwd((char *)0x0,0x1000);
      sVar7 = strlen((char *)__s_00);
      cVar1 = *(char *)((long)__s_00 + (sVar7 - 1));
      while (cVar1 == '\n') {
        *(undefined1 *)((long)__s_00 + (sVar7 - 1)) = 0;
        sVar7 = strlen((char *)__s_00);
        cVar1 = *(char *)((long)__s_00 + (sVar7 - 1));
      }
      snprintf((char *)local_748,0x80,"%s",__s_00);
      pcVar10 = slurpfile((size_t *)0x0,"%s/%s",local_748,"test_patterns_2.tar.uu");
      if (pcVar10 != (char *)0x0) goto LAB_00107c25;
      sVar7 = strlen((char *)&local_538);
      strncat((char *)&local_538,(char *)local_748,0x1ff - sVar7);
      sVar7 = strlen((char *)&local_538);
      strncat((char *)&local_538,"\n",0x1ff - sVar7);
      snprintf((char *)local_748,0x80,"%s/test",__s_00);
      pcVar10 = slurpfile((size_t *)0x0,"%s/%s",local_748,"test_patterns_2.tar.uu");
      if (pcVar10 != (char *)0x0) goto LAB_00107c25;
      sVar7 = strlen((char *)&local_538);
      strncat((char *)&local_538,(char *)local_748,0x1ff - sVar7);
      sVar7 = strlen((char *)&local_538);
      strncat((char *)&local_538,"\n",0x1ff - sVar7);
      snprintf((char *)local_748,0x80,"%s/%s/test",__s_00,"bsdtar");
      pcVar10 = slurpfile((size_t *)0x0,"%s/%s",local_748,"test_patterns_2.tar.uu");
      if (pcVar10 != (char *)0x0) goto LAB_00107c25;
      sVar7 = strlen((char *)&local_538);
      strncat((char *)&local_538,(char *)local_748,0x1ff - sVar7);
      sVar7 = strlen((char *)&local_538);
      strncat((char *)&local_538,"\n",0x1ff - sVar7);
      snprintf((char *)local_748,0x80,"%s/%s/test",__s_00,"tar");
      pcVar10 = slurpfile((size_t *)0x0,"%s/%s",local_748,"test_patterns_2.tar.uu");
      if (pcVar10 != (char *)0x0) goto LAB_00107c25;
      sVar7 = strlen((char *)&local_538);
      strncat((char *)&local_538,(char *)local_748,0x1ff - sVar7);
      sVar7 = strlen((char *)&local_538);
      strncat((char *)&local_538,"\n",0x1ff - sVar7);
      if (*__s_00 != 0x6a626f2f7273752f) goto LAB_001079c4;
      snprintf((char *)local_748,0x80,"%s",__s_00 + 1);
      pcVar10 = slurpfile((size_t *)0x0,"%s/%s",local_748,"test_patterns_2.tar.uu");
      if (pcVar10 != (char *)0x0) goto LAB_00107c25;
      sVar7 = strlen((char *)&local_538);
      strncat((char *)&local_538,(char *)local_748,0x1ff - sVar7);
      sVar7 = strlen((char *)&local_538);
      strncat((char *)&local_538,"\n",0x1ff - sVar7);
      snprintf((char *)local_748,0x80,"%s/test",__s_00 + 1);
      pcVar10 = slurpfile((size_t *)0x0,"%s/%s",local_748,"test_patterns_2.tar.uu");
    }
    else {
      __s_00 = (long *)0x0;
      snprintf((char *)local_748,0x80,"%s",pcVar10);
      pcVar10 = slurpfile((size_t *)0x0,"%s/%s",local_748,"test_patterns_2.tar.uu");
    }
    if (pcVar10 == (char *)0x0) {
      sVar7 = strlen((char *)&local_538);
      strncat((char *)&local_538,(char *)local_748,0x1ff - sVar7);
      sVar7 = strlen((char *)&local_538);
      strncat((char *)&local_538,"\n",0x1ff - sVar7);
LAB_001079c4:
      printf("Unable to locate known reference file %s\n","test_patterns_2.tar.uu");
      printf("  Checked following directories:\n%s\n",&local_538);
      exit(1);
    }
LAB_00107c25:
    free(pcVar10);
    free(__s_00);
    local_780 = strdup((char *)local_748);
    refdir = local_780;
    putchar(10);
    puts("If tests fail or crash, details will be in:");
    printf("   %s\n",local_678);
    putchar(10);
    if (verbosity < L'\0') {
      printf("Running ");
      fflush(_stdout);
    }
    else {
      printf("Reference files will be read from: %s\n",refdir);
      printf("Running tests on: %s\n",testprog);
      printf("Exercising: ");
      fflush(_stdout);
      systemf("%s --version",testprog);
      putchar(10);
    }
    local_79c = 0;
    uVar20 = 0;
LAB_00107d2f:
    pcVar10 = *ppcVar18;
    local_790 = ppcVar18;
    while( true ) {
      uVar4 = get_test_set((int *)local_748,0x34,pcVar10,tests);
      local_770 = __s_01;
      if ((int)uVar4 < 0) break;
      uVar12 = uVar20;
      if (uVar4 != 0) {
        uVar12 = uVar4 + uVar20;
        uVar21 = 0;
        do {
          wVar3 = failures;
          uVar2 = local_748[uVar21];
          if (verbosity != L'\xffffffff') {
            if (verbosity == L'\0') {
              printf("%3d: %-50s",(ulong)uVar2,tests[(int)uVar2].name);
              fflush(_stdout);
            }
            else {
              printf("%3d: %s\n",(ulong)uVar2,tests[(int)uVar2].name);
            }
          }
          wVar5 = assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/main.c"
                                  ,L'ं',local_678);
          if (wVar5 == L'\0') {
LAB_001083ac:
            main_cold_6();
            goto switchD_0010771d_caseD_6c;
          }
          sprintf(local_578,"%s.log",tests[(int)uVar2].name);
          logfile = (FILE *)fopen(local_578,"w");
          fprintf((FILE *)logfile,"%s\n\n",tests[(int)uVar2].name);
          snprintf((char *)&local_538,0x400,"%s/%s",local_678,tests[(int)uVar2].name);
          testworkdir = (char *)&local_538;
          wVar5 = assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/main.c"
                                     ,L'ऎ',(char *)&local_538,L'ǭ');
          if ((wVar5 == L'\0') ||
             (wVar5 = assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/main.c"
                                      ,L'ए',testworkdir), wVar5 == L'\0')) {
            main_cold_5();
LAB_0010839f:
            main_cold_4();
            goto LAB_001083ac;
          }
          setlocale(6,"C");
          __mask = umask(0);
          umask(__mask);
          (*tests[(int)uVar2].func)();
          testworkdir = (char *)0x0;
          umask(__mask);
          setlocale(6,"C");
          wVar6 = assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/main.c"
                                  ,L'थ',local_678);
          wVar5 = failures;
          if (wVar6 == L'\0') goto LAB_0010839f;
          tests[(int)uVar2].failures = failures - wVar3;
          if (verbosity == L'\0') {
            pcVar10 = "FAIL\n";
            if (wVar5 == wVar3) {
              pcVar10 = "ok\n";
            }
            printf(pcVar10);
          }
          else if (verbosity == L'\xffffffff') {
            pcVar10 = "E";
            if (wVar5 == wVar3) {
              pcVar10 = ".";
            }
            printf(pcVar10);
            fflush(_stdout);
          }
          uVar20 = uVar20 + 1;
          log_console = (wchar_t)(verbosity == L'\x01');
          uVar19 = 0;
          do {
            if ((1 < failed_lines[uVar19].count) && (failed_lines[uVar19].skip == 0)) {
              logprintf("%s:%d: Summary: Failed %d times\n",failed_filename,uVar19 & 0xffffffff);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != 10000);
          failed_filename = (char *)0x0;
          memset(failed_lines,0,80000);
          fclose((FILE *)logfile);
          logfile = (FILE *)0x0;
          iVar13 = tests[(int)uVar2].failures;
          if ((iVar13 == 0) && ((keep_temp_files & 1) == 0)) {
            wVar3 = assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/main.c"
                                    ,L'ल',local_678);
            if (wVar3 != L'\0') {
              systemf("rm -rf %s",tests[(int)uVar2].name);
              systemf("rm %s",local_578);
            }
            iVar13 = tests[(int)uVar2].failures;
          }
          if ((iVar13 != 0) && (local_79c = local_79c + 1, until_failure != L'\0'))
          goto LAB_001080da;
          uVar21 = uVar21 + 1;
        } while (uVar21 != uVar4);
      }
      uVar20 = uVar12;
      local_790 = local_790 + (*local_790 != (char *)0x0);
      pcVar10 = *local_790;
      if (pcVar10 == (char *)0x0) goto code_r0x001080cd;
    }
    goto LAB_001083c9;
  }
  sVar7 = strlen(__s);
  sVar9 = strlen(__dest);
  pcVar10 = __dest;
  __dest = (char *)realloc(__dest,sVar7 + sVar9 + 2);
  if (__dest != (char *)0x0) {
    sVar7 = strlen(__s);
    sVar9 = strlen(__dest);
    memmove(__dest + sVar7 + 1,__dest,sVar9);
    memcpy(__dest,__s,sVar7);
    __dest[sVar7] = '/';
    goto LAB_001075b0;
  }
  goto LAB_00108402;
code_r0x001080cd:
  if (until_failure == L'\0') {
LAB_001080da:
    free(local_778);
    free(__dest);
    free(__s);
    if (L'\xffffffff' < verbosity) {
      putchar(10);
      puts("Totals:");
      printf("  Tests run:         %8d\n",(ulong)uVar20);
      printf("  Tests failed:      %8d\n",(ulong)local_79c);
      printf("  Assertions checked:%8d\n",(ulong)(uint)assertions);
      printf("  Assertions failed: %8d\n",(ulong)(uint)failures);
      printf("  Skips reported:    %8d\n",(ulong)(uint)skips);
    }
    if (failures == L'\0') {
      if (verbosity == L'\xffffffff') {
        putchar(10);
      }
      printf("%d tests passed, no failures\n",(ulong)uVar20);
    }
    else {
      putchar(10);
      puts("Failing tests:");
      piVar22 = &tests[0].failures;
      uVar21 = 0;
      do {
        if (*piVar22 != 0) {
          printf("  %d: %s (%d failures)\n",uVar21 & 0xffffffff,*(char **)(piVar22 + -2));
        }
        uVar21 = uVar21 + 1;
        piVar22 = piVar22 + 6;
      } while (uVar21 != 0x34);
      putchar(10);
      printf("Details for failing tests: %s\n",local_678);
      putchar(10);
    }
    free(local_780);
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/main.c"
                    ,L'ଞ',"..");
    rmdir(local_678);
    return (uint)(local_79c != 0);
  }
  goto LAB_00107d2f;
switchD_0010771d_caseD_6c:
  main_cold_2();
LAB_001083c1:
  main_cold_3();
LAB_001083c9:
  printf("*** INVALID Test %s\n",*local_790);
  free(local_780);
  free(__dest);
  usage(local_770);
  pcVar10 = local_770;
LAB_001083fd:
  main_cold_9();
LAB_00108402:
  main_cold_1();
LAB_00108407:
  main_cold_8();
  printf("Usage: %s [options] <test> <test> ...\n",pcVar10);
  puts("Default is to run all tests.");
  puts("Otherwise, specify the numbers of the tests you wish to run.");
  puts("Options:");
  puts("  -d  Dump core after any failure, for debugging.");
  puts("  -k  Keep all temp files.");
  puts("      Default: temp files for successful tests deleted.");
  puts("  -p <path>  Path to executable to be tested.");
  puts("      Default: path taken from BSDTAR environment variable.");
  puts("  -q  Quiet.");
  puts("  -r <dir>   Path to dir containing reference files.");
  puts("      Default: Current directory.");
  puts("  -u  Keep running specifies tests until one fails.");
  puts("  -v  Verbose.");
  puts("Available tests:");
  ppcVar18 = &tests[0].name;
  uVar21 = 0;
  do {
    printf("  %d: %s\n",uVar21 & 0xffffffff,*ppcVar18);
    uVar21 = uVar21 + 1;
    ppcVar18 = ppcVar18 + 3;
  } while (uVar21 != 0x34);
  exit(1);
}

Assistant:

int
main(int argc, char **argv)
{
	static const int limit = sizeof(tests) / sizeof(tests[0]);
	int test_set[sizeof(tests) / sizeof(tests[0])];
	int i = 0, j = 0, tests_run = 0, tests_failed = 0, option;
	time_t now;
	char *refdir_alloc = NULL;
	const char *progname;
	char **saved_argv;
	const char *tmp, *option_arg, *p;
	char tmpdir[256], *pwd, *testprogdir, *tmp2 = NULL, *vlevel = NULL;
	char tmpdir_timestamp[256];

	(void)argc; /* UNUSED */

	/* Get the current dir. */
#ifdef PATH_MAX
	pwd = getcwd(NULL, PATH_MAX);/* Solaris getcwd needs the size. */
#else
	pwd = getcwd(NULL, 0);
#endif
	while (pwd[strlen(pwd) - 1] == '\n')
		pwd[strlen(pwd) - 1] = '\0';

#if defined(HAVE__CrtSetReportMode) && !defined(__WATCOMC__)
	/* To stop to run the default invalid parameter handler. */
	_set_invalid_parameter_handler(invalid_parameter_handler);
	/* Disable annoying assertion message box. */
	_CrtSetReportMode(_CRT_ASSERT, 0);
#endif

	/*
	 * Name of this program, used to build root of our temp directory
	 * tree.
	 */
	progname = p = argv[0];
	if ((testprogdir = (char *)malloc(strlen(progname) + 1)) == NULL)
	{
		fprintf(stderr, "ERROR: Out of memory.");
		exit(1);
	}
	strcpy(testprogdir, progname);
	while (*p != '\0') {
		/* Support \ or / dir separators for Windows compat. */
		if (*p == '/' || *p == '\\')
		{
			progname = p + 1;
			i = j;
		}
		++p;
		j++;
	}
	testprogdir[i] = '\0';
#if defined(_WIN32) && !defined(__CYGWIN__)
	if (testprogdir[0] != '/' && testprogdir[0] != '\\' &&
	    !(((testprogdir[0] >= 'a' && testprogdir[0] <= 'z') ||
	       (testprogdir[0] >= 'A' && testprogdir[0] <= 'Z')) &&
		testprogdir[1] == ':' &&
		(testprogdir[2] == '/' || testprogdir[2] == '\\')))
#else
	if (testprogdir[0] != '/')
#endif
	{
		/* Fixup path for relative directories. */
		if ((testprogdir = (char *)realloc(testprogdir,
			strlen(pwd) + 1 + strlen(testprogdir) + 1)) == NULL)
		{
			fprintf(stderr, "ERROR: Out of memory.");
			exit(1);
		}
		memmove(testprogdir + strlen(pwd) + 1, testprogdir,
		    strlen(testprogdir));
		memcpy(testprogdir, pwd, strlen(pwd));
		testprogdir[strlen(pwd)] = '/';
	}

#ifdef PROGRAM
	/* Get the target program from environment, if available. */
	testprogfile = getenv(ENVBASE);
#endif

	if (getenv("TMPDIR") != NULL)
		tmp = getenv("TMPDIR");
	else if (getenv("TMP") != NULL)
		tmp = getenv("TMP");
	else if (getenv("TEMP") != NULL)
		tmp = getenv("TEMP");
	else if (getenv("TEMPDIR") != NULL)
		tmp = getenv("TEMPDIR");
	else
		tmp = "/tmp";

	/* Allow -d to be controlled through the environment. */
	if (getenv(ENVBASE "_DEBUG") != NULL)
		dump_on_failure = 1;

	/* Allow -v to be controlled through the environment. */
	if (getenv("_VERBOSITY_LEVEL") != NULL)
	{
		vlevel = getenv("_VERBOSITY_LEVEL");
		verbosity = atoi(vlevel);
		if (verbosity < VERBOSITY_SUMMARY_ONLY || verbosity > VERBOSITY_FULL)
		{
			/* Unsupported verbosity levels are silently ignored */
			vlevel = NULL;
			verbosity = VERBOSITY_PASSFAIL;
		}
	}

	/* Get the directory holding test files from environment. */
	refdir = getenv(ENVBASE "_TEST_FILES");

	/*
	 * Parse options, without using getopt(), which isn't available
	 * on all platforms.
	 */
	++argv; /* Skip program name */
	while (*argv != NULL) {
		if (**argv != '-')
			break;
		p = *argv++;
		++p; /* Skip '-' */
		while (*p != '\0') {
			option = *p++;
			option_arg = NULL;
			/* If 'opt' takes an argument, parse that. */
			if (option == 'p' || option == 'r') {
				if (*p != '\0')
					option_arg = p;
				else if (*argv == NULL) {
					fprintf(stderr,
					    "Option -%c requires argument.\n",
					    option);
					usage(progname);
				} else
					option_arg = *argv++;
				p = ""; /* End of this option word. */
			}

			/* Now, handle the option. */
			switch (option) {
			case 'd':
				dump_on_failure = 1;
				break;
			case 'k':
				keep_temp_files = 1;
				break;
			case 'p':
#ifdef PROGRAM
				testprogfile = option_arg;
#else
				fprintf(stderr, "-p option not permitted\n");
				usage(progname);
#endif
				break;
			case 'q':
				if (!vlevel)
					verbosity--;
				break;
			case 'r':
				refdir = option_arg;
				break;
			case 'u':
				until_failure++;
				break;
			case 'v':
				if (!vlevel)
					verbosity++;
				break;
			default:
				fprintf(stderr, "Unrecognized option '%c'\n",
				    option);
				usage(progname);
			}
		}
	}

	/*
	 * Sanity-check that our options make sense.
	 */
#ifdef PROGRAM
	if (testprogfile == NULL)
	{
		if ((tmp2 = (char *)malloc(strlen(testprogdir) + 1 +
			strlen(PROGRAM) + 1)) == NULL)
		{
			fprintf(stderr, "ERROR: Out of memory.");
			exit(1);
		}
		strcpy(tmp2, testprogdir);
		strcat(tmp2, "/");
		strcat(tmp2, PROGRAM);
		testprogfile = tmp2;
	}

	{
		char *testprg;
#if defined(_WIN32) && !defined(__CYGWIN__)
		/* Command.com sometimes rejects '/' separators. */
		testprg = strdup(testprogfile);
		for (i = 0; testprg[i] != '\0'; i++) {
			if (testprg[i] == '/')
				testprg[i] = '\\';
		}
		testprogfile = testprg;
#endif
		/* Quote the name that gets put into shell command lines. */
		testprg = malloc(strlen(testprogfile) + 3);
		strcpy(testprg, "\"");
		strcat(testprg, testprogfile);
		strcat(testprg, "\"");
		testprog = testprg;
	}
#endif

#if !defined(_WIN32) && defined(SIGPIPE)
	{   /* Ignore SIGPIPE signals */
		struct sigaction sa;
		sa.sa_handler = SIG_IGN;
		sigemptyset(&sa.sa_mask);
		sa.sa_flags = 0;
		sigaction(SIGPIPE, &sa, NULL);
	}
#endif

	/*
	 * Create a temp directory for the following tests.
	 * Include the time the tests started as part of the name,
	 * to make it easier to track the results of multiple tests.
	 */
	now = time(NULL);
	for (i = 0; ; i++) {
		strftime(tmpdir_timestamp, sizeof(tmpdir_timestamp),
		    "%Y-%m-%dT%H.%M.%S",
		    localtime(&now));
		sprintf(tmpdir, "%s/%s.%s-%03d", tmp, progname,
		    tmpdir_timestamp, i);
		if (assertMakeDir(tmpdir,0755))
			break;
		if (i >= 999) {
			fprintf(stderr,
			    "ERROR: Unable to create temp directory %s\n",
			    tmpdir);
			exit(1);
		}
	}

	/*
	 * If the user didn't specify a directory for locating
	 * reference files, try to find the reference files in
	 * the "usual places."
	 */
	refdir = refdir_alloc = get_refdir(refdir);

	/*
	 * Banner with basic information.
	 */
	printf("\n");
	printf("If tests fail or crash, details will be in:\n");
	printf("   %s\n", tmpdir);
	printf("\n");
	if (verbosity > VERBOSITY_SUMMARY_ONLY) {
		printf("Reference files will be read from: %s\n", refdir);
#ifdef PROGRAM
		printf("Running tests on: %s\n", testprog);
#endif
		printf("Exercising: ");
		fflush(stdout);
		printf("%s\n", EXTRA_VERSION);
	} else {
		printf("Running ");
		fflush(stdout);
	}

	/*
	 * Run some or all of the individual tests.
	 */
	saved_argv = argv;
	do {
		argv = saved_argv;
		do {
			int test_num;

			test_num = get_test_set(test_set, limit, *argv, tests);
			if (test_num < 0) {
				printf("*** INVALID Test %s\n", *argv);
				free(refdir_alloc);
				free(testprogdir);
				usage(progname);
				return (1);
			}
			for (i = 0; i < test_num; i++) {
				tests_run++;
				if (test_run(test_set[i], tmpdir)) {
					tests_failed++;
					if (until_failure)
						goto finish;
				}
			}
			if (*argv != NULL)
				argv++;
		} while (*argv != NULL);
	} while (until_failure);

finish:
	/* Must be freed after all tests run */
	free(tmp2);
	free(testprogdir);
	free(pwd);

	/*
	 * Report summary statistics.
	 */
	if (verbosity > VERBOSITY_SUMMARY_ONLY) {
		printf("\n");
		printf("Totals:\n");
		printf("  Tests run:         %8d\n", tests_run);
		printf("  Tests failed:      %8d\n", tests_failed);
		printf("  Assertions checked:%8d\n", assertions);
		printf("  Assertions failed: %8d\n", failures);
		printf("  Skips reported:    %8d\n", skips);
	}
	if (failures) {
		printf("\n");
		printf("Failing tests:\n");
		for (i = 0; i < limit; ++i) {
			if (tests[i].failures)
				printf("  %d: %s (%d failures)\n", i,
				    tests[i].name, tests[i].failures);
		}
		printf("\n");
		printf("Details for failing tests: %s\n", tmpdir);
		printf("\n");
	} else {
		if (verbosity == VERBOSITY_SUMMARY_ONLY)
			printf("\n");
		printf("%d tests passed, no failures\n", tests_run);
	}

	free(refdir_alloc);

	/* If the final tmpdir is empty, we can remove it. */
	/* This should be the usual case when all tests succeed. */
	assertChdir("..");
	rmdir(tmpdir);

	return (tests_failed ? 1 : 0);
}